

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O1

ParseNodePtr __thiscall
Parser::ParseArgList<true>
          (Parser *this,bool *pCallOfConstants,uint16 *pSpreadArgCount,uint16 *pCount)

{
  long lVar1;
  code *pcVar2;
  bool bVar3;
  tokens tVar4;
  undefined4 *puVar5;
  ParseNodePtr pPVar6;
  Parser *this_00;
  int iVar7;
  undefined1 local_78 [8];
  IdentToken token;
  ParseNode *local_50;
  ParseNodePtr pnodeList;
  ParseNodePtr *lastNodeRef;
  bool *local_38;
  
  local_50 = (ParseNodePtr)0x0;
  pnodeList = (ParseNodePtr)0x0;
  lastNodeRef = (ParseNodePtr *)pSpreadArgCount;
  local_38 = pCallOfConstants;
  if ((this->m_token).tk != tkLParen) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                       ,0x10dc,"(m_token.tk == tkLParen)","m_token.tk == tkLParen");
    if (!bVar3) goto LAB_00ea4a73;
    *puVar5 = 0;
  }
  token._16_8_ = &this->m_scan;
  tVar4 = Scanner<UTF8EncodingPolicyBase<false>_>::Scan
                    ((Scanner<UTF8EncodingPolicyBase<false>_> *)token._16_8_);
  pPVar6 = (ParseNodePtr)0x0;
  if (tVar4 != tkRParen) {
    *local_38 = true;
    *(undefined2 *)lastNodeRef = 0;
    iVar7 = -0xfff9;
    while( true ) {
      local_78._0_4_ = tkNone;
      token.tk = tkNone;
      token._4_4_ = 0;
      pPVar6 = ParseExpr<true>(this,1,(BOOL *)0x0,1,1,(LPCOLESTR)0x0,(uint32 *)0x0,(uint32 *)0x0,
                               (IdentToken *)local_78,false,(bool *)0x0,(charcount_t *)0x0,
                               (bool *)0x0);
      MarkEscapingRef(this,pPVar6,(IdentToken *)local_78);
      CheckArguments(this,pPVar6);
      if ((*local_38 == true) && (pPVar6->nop != knopFlt)) {
        if (pPVar6->nop == knopInt) {
          ParseNode::AsParseNodeInt(pPVar6);
        }
        else {
          *local_38 = false;
        }
      }
      if (pPVar6->nop == knopEllipsis) {
        *(short *)lastNodeRef = *(short *)lastNodeRef + 1;
      }
      AddToNodeList(this,&local_50,(ParseNode ***)&pnodeList,pPVar6);
      pPVar6->field_0x1 = pPVar6->field_0x1 | 2;
      if ((this->m_token).tk != tkComma) break;
      this_00 = (Parser *)token._16_8_;
      Scanner<UTF8EncodingPolicyBase<false>_>::Scan
                ((Scanner<UTF8EncodingPolicyBase<false>_> *)token._16_8_);
      if (((this->m_token).tk == tkRParen) &&
         (((this->m_scriptContext->config).threadConfig)->m_ES7TrailingComma != false)) break;
      iVar7 = iVar7 + 1;
      if (iVar7 == 0) {
        Error(this_00,-0x7ff5fbfb,L"",L"");
      }
    }
    pPVar6 = pnodeList;
    *pCount = (short)iVar7 - 6;
    if (pnodeList == (ParseNodePtr)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                         ,0x1116,"(lastNodeRef)","lastNodeRef");
      if (!bVar3) goto LAB_00ea4a73;
      *puVar5 = 0;
    }
    lVar1._0_1_ = pPVar6->nop;
    lVar1._1_1_ = pPVar6->field_0x1;
    lVar1._2_2_ = pPVar6->grfpn;
    lVar1._4_4_ = pPVar6->ichMin;
    if (lVar1 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                         ,0x1117,"(*lastNodeRef)","*lastNodeRef");
      if (!bVar3) {
LAB_00ea4a73:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
    local_50->ichLim = *(charcount_t *)(*(long *)pPVar6 + 8);
    pPVar6 = local_50;
  }
  return pPVar6;
}

Assistant:

ParseNodePtr Parser::ParseArgList(bool *pCallOfConstants, uint16 *pSpreadArgCount, uint16 * pCount)
{
    ParseNodePtr pnodeArg;
    ParseNodePtr pnodeList = nullptr;
    ParseNodePtr *lastNodeRef = nullptr;

    // Check for an empty list
    Assert(m_token.tk == tkLParen);

    if (this->GetScanner()->Scan() == tkRParen)
    {
        return nullptr;
    }

    *pCallOfConstants = true;
    *pSpreadArgCount = 0;

    int count = 0;
    while (true)
    {
        if (count >= Js::Constants::MaxAllowedArgs)
        {
            Error(ERRTooManyArgs);
        }
        // Allow spread in argument lists.
        IdentToken token;
        pnodeArg = ParseExpr<buildAST>(koplCma, nullptr, TRUE, /* fAllowEllipsis */TRUE, NULL, nullptr, nullptr, &token);
        ++count;
        this->MarkEscapingRef(pnodeArg, &token);

        if (buildAST)
        {
            this->CheckArguments(pnodeArg);

            if (*pCallOfConstants && !IsConstantInFunctionCall(pnodeArg))
            {
                *pCallOfConstants = false;
            }

            if (pnodeArg->nop == knopEllipsis)
            {
                (*pSpreadArgCount)++;
            }

            AddToNodeListEscapedUse(&pnodeList, &lastNodeRef, pnodeArg);
        }
        if (m_token.tk != tkComma)
        {
            break;
        }
        this->GetScanner()->Scan();

        if (m_token.tk == tkRParen && m_scriptContext->GetConfig()->IsES7TrailingCommaEnabled())
        {
            break;
        }
    }

    if (pSpreadArgCount != nullptr && (*pSpreadArgCount) > 0) {
        CHAKRATEL_LANGSTATS_INC_LANGFEATURECOUNT(ES6, SpreadFeature, m_scriptContext);
    }

    *pCount = static_cast<uint16>(count);
    if (buildAST)
    {
        Assert(lastNodeRef);
        Assert(*lastNodeRef);
        pnodeList->ichLim = (*lastNodeRef)->ichLim;
    }

    return pnodeList;
}